

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

golf_material_t *
golf_material_diffuse_color
          (golf_material_t *__return_storage_ptr__,char *name,float friction,float vel_scale,
          float restitution,vec4 color)

{
  float local_28;
  float fStack_24;
  
  __return_storage_ptr__->active = true;
  snprintf(__return_storage_ptr__->name,0x40,"%s",name);
  __return_storage_ptr__->friction = friction;
  __return_storage_ptr__->restitution = restitution;
  __return_storage_ptr__->vel_scale = vel_scale;
  __return_storage_ptr__->type = GOLF_MATERIAL_DIFFUSE_COLOR;
  local_28 = color.x;
  fStack_24 = color.y;
  (__return_storage_ptr__->field_6).color.x = local_28;
  (__return_storage_ptr__->field_6).color.y = fStack_24;
  (__return_storage_ptr__->field_6).color.z = color.z;
  (__return_storage_ptr__->field_6).color.w = color.w;
  return __return_storage_ptr__;
}

Assistant:

golf_material_t golf_material_diffuse_color(const char *name, float friction, float vel_scale, float restitution, vec4 color) {
    golf_material_t material;
    material.active = true;
    snprintf(material.name, GOLF_MAX_NAME_LEN, "%s", name);
    material.friction = friction;
    material.restitution = restitution;
    material.vel_scale = vel_scale;
    material.type = GOLF_MATERIAL_DIFFUSE_COLOR;
    material.color = color;
    return material;
}